

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool bssl::tls13_init_early_key_schedule(SSL_HANDSHAKE *hs,SSL_SESSION *session)

{
  bool bVar1;
  uint16_t version;
  size_t in_R8;
  SSL_HANDSHAKE *hs_00;
  Span<const_unsigned_char> in;
  
  if ((hs->ssl->field_0xa4 & 1) != 0) {
    __assert_fail("!hs->ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x50,
                  "bool bssl::tls13_init_early_key_schedule(SSL_HANDSHAKE *, const SSL_SESSION *)");
  }
  hs_00 = (SSL_HANDSHAKE *)&hs->inner_transcript;
  if ((hs->selected_ech_config)._M_t.super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>
      ._M_t.super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0) {
    hs_00 = (SSL_HANDSHAKE *)&hs->transcript;
  }
  version = ssl_session_protocol_version(session);
  bVar1 = init_key_schedule(hs,(SSLTranscript *)hs_00,version,session->cipher);
  if (bVar1) {
    in.data_ = (uchar *)(ulong)(session->secret).size_;
    in.size_ = in_R8;
    bVar1 = hkdf_extract_to_secret((bssl *)hs,hs_00,(SSLTranscript *)&session->secret,in);
    return bVar1;
  }
  return false;
}

Assistant:

bool tls13_init_early_key_schedule(SSL_HANDSHAKE *hs,
                                   const SSL_SESSION *session) {
  assert(!hs->ssl->server);
  // When offering ECH, early data is associated with ClientHelloInner, not
  // ClientHelloOuter.
  SSLTranscript *transcript =
      hs->selected_ech_config ? &hs->inner_transcript : &hs->transcript;
  return init_key_schedule(hs, transcript,
                           ssl_session_protocol_version(session),
                           session->cipher) &&
         hkdf_extract_to_secret(hs, *transcript, session->secret);
}